

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::report_race
          (Fasttrack<std::shared_mutex> *this,uint32_t thr1,uint32_t thr2,bool wr1,bool wr2,
          VarState *var,size_t address)

{
  VarState *pVVar1;
  ctrl_t *pcVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  list<unsigned_long,_std::allocator<unsigned_long>_> stack2;
  list<unsigned_long,_std::allocator<unsigned_long>_> stack1;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_348;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_330;
  VarState *local_318;
  undefined1 local_310 [16];
  ulong local_300;
  undefined1 local_258 [184];
  undefined1 local_1a0;
  undefined1 local_19f;
  uint32_t local_19c;
  undefined4 local_198;
  ulong local_190;
  ulong local_188;
  undefined8 local_180;
  size_t local_178;
  undefined8 local_170;
  unsigned_long local_168 [16];
  undefined1 local_e8;
  undefined1 local_e7;
  uint32_t local_e4;
  undefined4 local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined8 local_c8;
  size_t local_c0;
  undefined8 local_b8;
  unsigned_long local_b0 [16];
  
  local_310._0_8_ = ZEXT48(thr1);
  local_318 = var;
  cVar3 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)&this->threads,(key_arg<unsigned_long> *)local_310);
  local_310._0_8_ = ZEXT48(thr2);
  cVar4 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)&this->threads,(key_arg<unsigned_long> *)local_310);
  pcVar2 = (this->threads).
           super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           .
           super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           .ctrl_ + (this->threads).
                    super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                    .
                    super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                    .capacity_;
  if (cVar4.inner_.ctrl_ != pcVar2 && cVar3.inner_.ctrl_ != pcVar2) {
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_310,
               (StackTrace *)(*(long *)((long)cVar3.inner_.field_1.slot_ + 8) + 0x38),address);
    local_330._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_310._0_8_;
    local_330._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_310._8_8_;
    local_330._M_impl._M_node._M_size = local_300;
    if ((_List_node_base *)local_310._0_8_ == (_List_node_base *)local_310) {
      local_330._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_330;
      local_330._M_impl._M_node.super__List_node_base._M_prev =
           local_330._M_impl._M_node.super__List_node_base._M_next;
    }
    else {
      (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_310._8_8_)->_M_impl).
      _M_node.super__List_node_base._M_next = (_List_node_base *)&local_330;
      *(_List_node_base **)(local_310._0_8_ + 8) = (_List_node_base *)&local_330;
      local_300 = 0;
      local_310._0_8_ = (_List_node_base *)local_310;
      local_310._8_8_ = (_List_node_base *)local_310;
    }
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
              ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_310);
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_310,
               (StackTrace *)(*(long *)((long)cVar4.inner_.field_1.slot_ + 8) + 0x38),address);
    local_348._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_310._0_8_;
    local_348._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_310._8_8_;
    local_348._M_impl._M_node._M_size = local_300;
    if ((_List_node_base *)local_310._0_8_ == (_List_node_base *)local_310) {
      local_348._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_348;
      local_348._M_impl._M_node.super__List_node_base._M_prev =
           local_348._M_impl._M_node.super__List_node_base._M_next;
    }
    else {
      (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_310._8_8_)->_M_impl).
      _M_node.super__List_node_base._M_next = (_List_node_base *)&local_348;
      *(_List_node_base **)(local_310._0_8_ + 8) = (_List_node_base *)&local_348;
      local_300 = 0;
      local_310._0_8_ = (_List_node_base *)local_310;
      local_310._8_8_ = (_List_node_base *)local_310;
    }
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
              ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_310);
    while (0x10 < local_330._M_impl._M_node._M_size) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_330);
    }
    while (pVVar1 = local_318, 0x10 < local_348._M_impl._M_node._M_size) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_348);
    }
    local_b0[0xe] = 0;
    local_b0[0xf] = 0;
    local_b0[0xc] = 0;
    local_b0[0xd] = 0;
    local_b0[10] = 0;
    local_b0[0xb] = 0;
    local_b0[8] = 0;
    local_b0[9] = 0;
    local_b0[6] = 0;
    local_b0[7] = 0;
    local_b0[4] = 0;
    local_b0[5] = 0;
    local_b0[2] = 0;
    local_b0[3] = 0;
    local_b0[0] = 0;
    local_b0[1] = 0;
    local_c0 = address;
    local_d0 = (ulong)local_318->size;
    local_e0 = 0;
    local_b8 = 0;
    local_c8 = 0;
    local_e7 = 0;
    local_d8 = local_330._M_impl._M_node._M_size;
    local_e8 = wr1;
    local_e4 = thr1;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_List_iterator<unsigned_long>,unsigned_long*>
              ((_List_iterator<unsigned_long>)
               local_330._M_impl._M_node.super__List_node_base._M_next,(_List_node_base *)&local_330
               ,local_b0);
    local_168[0xe] = 0;
    local_168[0xf] = 0;
    local_168[0xc] = 0;
    local_168[0xd] = 0;
    local_168[10] = 0;
    local_168[0xb] = 0;
    local_168[8] = 0;
    local_168[9] = 0;
    local_168[6] = 0;
    local_168[7] = 0;
    local_168[4] = 0;
    local_168[5] = 0;
    local_168[2] = 0;
    local_168[3] = 0;
    local_168[0] = 0;
    local_168[1] = 0;
    local_178 = address;
    local_188 = (ulong)pVVar1->size;
    local_198 = 0;
    local_170 = 0;
    local_180 = 0;
    local_19f = 0;
    local_190 = local_348._M_impl._M_node._M_size;
    local_1a0 = wr2;
    local_19c = thr2;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_List_iterator<unsigned_long>,unsigned_long*>
              ((_List_iterator<unsigned_long>)
               local_348._M_impl._M_node.super__List_node_base._M_next,(_List_node_base *)&local_348
               ,local_168);
    memcpy((Race *)local_310,&local_e8,0xb8);
    memcpy(local_258,&local_1a0,0xb8);
    (*this->clb)((Race *)local_310,this->clb_context);
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_348);
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_330);
  }
  return;
}

Assistant:

void report_race(uint32_t thr1, uint32_t thr2, bool wr1, bool wr2,
                   const VarState& var, size_t address) const {
    auto it = threads.find(thr1);
    auto it2 = threads.find(thr2);
    auto it_end = threads.end();

    if (it == it_end ||
        it2 == it_end) {  // if thread_id is, because of finishing, not in stack
                          // traces anymore, return
      return;
    }
    std::list<size_t> stack1(
        std::move(it->second->get_stackDepot().return_stack_trace(address)));
    std::list<size_t> stack2(
        std::move(it2->second->get_stackDepot().return_stack_trace(address)));

    while (stack1.size() > Detector::max_stack_size) {
      stack1.pop_front();
    }
    while (stack2.size() > Detector::max_stack_size) {
      stack2.pop_front();
    }

    Detector::AccessEntry access1;
    access1.thread_id = thr1;
    access1.write = wr1;
    access1.accessed_memory = address;
    access1.access_size = var.size;
    access1.access_type = 0;
    access1.heap_block_begin = 0;
    access1.heap_block_size = 0;
    access1.onheap = false;
    access1.stack_size = stack1.size();
    std::copy(stack1.begin(), stack1.end(), access1.stack_trace.begin());

    Detector::AccessEntry access2;
    access2.thread_id = thr2;
    access2.write = wr2;
    access2.accessed_memory = address;
    access2.access_size = var.size;
    access2.access_type = 0;
    access2.heap_block_begin = 0;
    access2.heap_block_size = 0;
    access2.onheap = false;
    access2.stack_size = stack2.size();
    std::copy(stack2.begin(), stack2.end(), access2.stack_trace.begin());

    Detector::Race race;
    race.first = access1;
    race.second = access2;

    clb(&race, clb_context);
  }